

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O3

string * __thiscall
tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,double v)

{
  size_t sVar1;
  string *extraout_RAX;
  char *buffer;
  int length;
  int local_b0;
  int local_ac;
  char local_a8 [136];
  
  if (NAN(v)) {
    __assert_fail("!std::isnan(value)",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/dtoa_milo.h"
                  ,0x191,"void dtoa_milo(double, char *)");
  }
  if (ABS(v) != INFINITY) {
    if (2.220446049250313e-16 <= ABS(v)) {
      if (0.0 <= v) {
        buffer = local_a8;
      }
      else {
        buffer = local_a8 + 1;
        local_a8[0] = 0x2d;
        v = -v;
      }
      Grisu2(v,buffer,&local_ac,&local_b0);
      Prettify(buffer,local_ac,local_b0);
    }
    else {
      builtin_strncpy(local_a8,"0.0",4);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(local_a8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_a8,local_a8 + sVar1);
    return extraout_RAX;
  }
  __assert_fail("!std::isinf(value)",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/dtoa_milo.h"
                ,0x192,"void dtoa_milo(double, char *)");
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const std::vector<uint32_t> &v) {
#if defined(TINYUSDZ_LOCAL_USE_JEAIII_ITOA)
  char buf[32];
#endif

  ofs << "[";
  for (size_t i = 0; i < v.size(); i++) {
    if (i > 0) {
      ofs << ", ";
    }
#if defined(TINYUSDZ_LOCAL_USE_JEAIII_ITOA)
    tinyusdz::itoa(v[i], buf);
    ofs << buf;
#else
    ofs << v[i];
#endif
  }
  ofs << "]";

  return ofs;
}